

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtest.c
# Opt level: O0

char * get_fp(char *filename,uint flags)

{
  char *s;
  char *toret;
  char *orig;
  uint flags_local;
  char *filename_local;
  
  s = get_line(filename);
  if (s == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = cleanup_fp(s,flags);
    safefree(s);
  }
  return filename_local;
}

Assistant:

char *get_fp(char *filename, unsigned flags)
{
    char *orig = get_line(filename);
    if (!orig)
        return NULL;
    char *toret = cleanup_fp(orig, flags);
    sfree(orig);
    return toret;
}